

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O3

void aiTransformVecByMatrix4(aiVector3D *vec,aiMatrix4x4 *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if (mat == (aiMatrix4x4 *)0x0) {
    __assert_fail("__null != mat",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0x277,"void aiTransformVecByMatrix4(aiVector3D *, const aiMatrix4x4 *)");
  }
  if (vec != (aiVector3D *)0x0) {
    fVar1 = vec->x;
    fVar2 = vec->y;
    fVar3 = vec->z;
    fVar4 = mat->b2;
    fVar5 = mat->b1;
    fVar6 = mat->b3;
    fVar7 = mat->b4;
    fVar8 = mat->c2;
    fVar9 = mat->c1;
    fVar10 = mat->c3;
    fVar11 = mat->c4;
    vec->x = mat->a4 + fVar3 * mat->a3 + fVar1 * mat->a1 + mat->a2 * fVar2;
    vec->y = fVar7 + fVar3 * fVar6 + fVar1 * fVar5 + fVar4 * fVar2;
    vec->z = fVar3 * fVar10 + fVar1 * fVar9 + fVar2 * fVar8 + fVar11;
    return;
  }
  __assert_fail("__null != vec",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x278,"void aiTransformVecByMatrix4(aiVector3D *, const aiMatrix4x4 *)");
}

Assistant:

ASSIMP_API void aiTransformVecByMatrix4(aiVector3D* vec,
    const aiMatrix4x4* mat)
{
    ai_assert( NULL != mat );
    ai_assert( NULL != vec );

    *vec *= (*mat);
}